

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderTextureGatherTests.cpp
# Opt level: O2

TextureBindingSp __thiscall
vkt::sr::anon_unknown_0::TextureGather2DInstance::createTexture(TextureGather2DInstance *this)

{
  Texture2D *this_00;
  ostringstream *this_01;
  TestLog *pTVar1;
  pointer pPVar2;
  pointer pPVar3;
  long lVar4;
  deUint32 seed;
  Texture2D *pTVar5;
  TextureBinding *this_02;
  ConstPixelBufferAccess *__n;
  void *__buf;
  SharedPtrStateBase *extraout_RDX;
  ConstPixelBufferAccess *access;
  long lVar6;
  long in_RSI;
  int levelNdx;
  long lVar7;
  long lVar8;
  TextureBindingSp TVar9;
  int local_374;
  long local_370;
  MovePtr<tcu::Texture2D,_de::DefaultDeleter<tcu::Texture2D>_> texture;
  int local_350;
  Vector<int,_2> local_348;
  Sampler local_340;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_300;
  string local_2e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2c0;
  string local_2a0;
  TextureFormatInfo texFmtInfo;
  LogImage local_240;
  MessageBuilder local_1b0;
  
  pTVar1 = *(TestLog **)(**(long **)(in_RSI + 8) + 0x10);
  tcu::getTextureFormatInfo(&texFmtInfo,(TextureFormat *)(in_RSI + 0x218));
  pTVar5 = (Texture2D *)operator_new(0x50);
  tcu::Texture2D::Texture2D
            (pTVar5,(TextureFormat *)(in_RSI + 0x218),*(int *)(in_RSI + 0x264),
             *(int *)(in_RSI + 0x268));
  local_340.compare = *(CompareMode *)(in_RSI + 0x220);
  local_340._0_8_ = *(undefined8 *)(in_RSI + 0x224);
  local_340.wrapR = REPEAT_GL;
  local_340._12_8_ = *(undefined8 *)(in_RSI + 0x240);
  local_340.lodThreshold = 0.0;
  local_340.normalizedCoords = true;
  local_340.depthStencilMode = MODE_DEPTH;
  local_340._32_8_ = 0;
  local_340.borderColor.v._4_5_ = 0;
  local_340.borderColor.v.uData[2]._1_3_ = 0;
  local_340._48_5_ = 0;
  pPVar2 = (pTVar5->super_TextureLevelPyramid).m_access.
           super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  pPVar3 = (pTVar5->super_TextureLevelPyramid).m_access.
           super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>.
           _M_impl.super__Vector_impl_data._M_start;
  this_01 = &local_1b0.m_str;
  local_370 = in_RSI;
  texture.super_UniqueBase<tcu::Texture2D,_de::DefaultDeleter<tcu::Texture2D>_>.m_data.ptr = pTVar5;
  for (local_374 = *(int *)(in_RSI + 0x248);
      pTVar5 = texture.super_UniqueBase<tcu::Texture2D,_de::DefaultDeleter<tcu::Texture2D>_>.m_data.
               ptr, local_350 = (int)(((long)pPVar2 - (long)pPVar3) / 0x28), local_374 < local_350;
      local_374 = local_374 + 1) {
    tcu::Texture2D::allocLevel
              (texture.super_UniqueBase<tcu::Texture2D,_de::DefaultDeleter<tcu::Texture2D>_>.m_data.
               ptr,local_374);
    access = &((texture.super_UniqueBase<tcu::Texture2D,_de::DefaultDeleter<tcu::Texture2D>_>.m_data
               .ptr)->super_TextureLevelPyramid).m_access.
              super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>.
              _M_impl.super__Vector_impl_data._M_start[local_374].super_ConstPixelBufferAccess;
    seed = tcu::CommandLine::getBaseSeed(*(CommandLine **)(**(long **)(local_370 + 8) + 0x18));
    fillWithRandomColorTiles
              ((PixelBufferAccess *)access,&texFmtInfo.valueMin,&texFmtInfo.valueMax,seed);
    de::toString<int>(&local_2a0,&local_374);
    std::operator+(&local_300,"InputTextureLevel",&local_2a0);
    de::toString<int>(&local_2e0,&local_374);
    std::operator+(&local_2c0,"Input texture, level ",&local_2e0);
    __n = access;
    tcu::LogImage::LogImage(&local_240,&local_300,&local_2c0,access,QP_IMAGE_COMPRESSION_MODE_BEST);
    tcu::LogImage::write(&local_240,(int)pTVar1,__buf,(size_t)__n);
    local_1b0.m_log = pTVar1;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)this_01);
    std::operator<<((ostream *)this_01,"Note: texture level\'s size is ");
    local_348.m_data = *(int (*) [2])(access->m_size).m_data;
    tcu::operator<<((ostream *)this_01,&local_348);
    tcu::MessageBuilder::operator<<(&local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)this_01);
    tcu::LogImage::~LogImage(&local_240);
    std::__cxx11::string::~string((string *)&local_2c0);
    std::__cxx11::string::~string((string *)&local_2e0);
    std::__cxx11::string::~string((string *)&local_300);
    std::__cxx11::string::~string((string *)&local_2a0);
  }
  tcu::Texture2D::Texture2D
            ((Texture2D *)&local_1b0,
             (TextureFormat *)
             texture.super_UniqueBase<tcu::Texture2D,_de::DefaultDeleter<tcu::Texture2D>_>.m_data.
             ptr,(texture.super_UniqueBase<tcu::Texture2D,_de::DefaultDeleter<tcu::Texture2D>_>.
                  m_data.ptr)->m_width,
             (texture.super_UniqueBase<tcu::Texture2D,_de::DefaultDeleter<tcu::Texture2D>_>.m_data.
             ptr)->m_height);
  lVar4 = local_370;
  this_00 = (Texture2D *)(local_370 + 0x288);
  tcu::Texture2D::operator=(this_00,(Texture2D *)&local_1b0);
  tcu::Texture3D::~Texture3D((Texture3D *)&local_1b0);
  lVar8 = 8;
  lVar6 = 0;
  for (lVar7 = 0;
      lVar7 < (int)(((long)(pTVar5->super_TextureLevelPyramid).m_access.
                           super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                    (long)(pTVar5->super_TextureLevelPyramid).m_access.
                          super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                          ._M_impl.super__Vector_impl_data._M_start) / 0x28); lVar7 = lVar7 + 1) {
    if (*(long *)((long)&((pTVar5->super_TextureLevelPyramid).m_data.
                          super__Vector_base<de::ArrayBuffer<unsigned_char,_1UL,_1UL>,_std::allocator<de::ArrayBuffer<unsigned_char,_1UL,_1UL>_>_>
                          ._M_impl.super__Vector_impl_data._M_start)->m_ptr + lVar8) != 0) {
      tcu::Texture2D::allocLevel(this_00,(int)lVar7);
      swizzlePixels((PixelBufferAccess *)(*(long *)(local_370 + 0x2a8) + lVar6),
                    (ConstPixelBufferAccess *)
                    ((long)(((pTVar5->super_TextureLevelPyramid).m_access.
                             super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                             ._M_impl.super__Vector_impl_data._M_start)->
                           super_ConstPixelBufferAccess).m_size.m_data + lVar6 + -8),
                    (MaybeTextureSwizzle *)(lVar4 + 0x22c));
    }
    lVar6 = lVar6 + 0x28;
    lVar8 = lVar8 + 0x10;
  }
  this_02 = (TextureBinding *)operator_new(0x68);
  pTVar5 = texture.super_UniqueBase<tcu::Texture2D,_de::DefaultDeleter<tcu::Texture2D>_>.m_data.ptr;
  texture.super_UniqueBase<tcu::Texture2D,_de::DefaultDeleter<tcu::Texture2D>_>.m_data.ptr =
       (Texture2D *)0x0;
  TextureBinding::TextureBinding(this_02,pTVar5,&local_340);
  de::SharedPtr<vkt::sr::TextureBinding>::SharedPtr
            ((SharedPtr<vkt::sr::TextureBinding> *)this,this_02);
  de::details::UniqueBase<tcu::Texture2D,_de::DefaultDeleter<tcu::Texture2D>_>::~UniqueBase
            (&texture.super_UniqueBase<tcu::Texture2D,_de::DefaultDeleter<tcu::Texture2D>_>);
  TVar9.m_state = extraout_RDX;
  TVar9.m_ptr = (TextureBinding *)this;
  return TVar9;
}

Assistant:

TextureBindingSp TextureGather2DInstance::createTexture (void)
{
	TestLog&						log			= m_context.getTestContext().getLog();
	const tcu::TextureFormatInfo	texFmtInfo	= tcu::getTextureFormatInfo(m_baseParams.textureFormat);
	MovePtr<tcu::Texture2D>			texture		= MovePtr<tcu::Texture2D>(new tcu::Texture2D(m_baseParams.textureFormat, m_textureSize.x(), m_textureSize.y()));
	const tcu::Sampler				sampler		(m_baseParams.wrapS, m_baseParams.wrapT, tcu::Sampler::REPEAT_GL,
												 m_baseParams.minFilter, m_baseParams.magFilter,
												 0.0f /* LOD threshold */, true /* normalized coords */, m_baseParams.shadowCompareMode);

	{
		const int	levelBegin	= m_baseParams.baseLevel;
		const int	levelEnd	= texture->getNumLevels();
		DE_ASSERT(m_baseParams.baseLevel < texture->getNumLevels());

		for (int levelNdx = levelBegin; levelNdx < levelEnd; levelNdx++)
		{
			texture->allocLevel(levelNdx);
			const PixelBufferAccess& level = texture->getLevel(levelNdx);
			fillWithRandomColorTiles(level, texFmtInfo.valueMin, texFmtInfo.valueMax, (deUint32)m_context.getTestContext().getCommandLine().getBaseSeed());
			log << TestLog::Image("InputTextureLevel" + de::toString(levelNdx), "Input texture, level " + de::toString(levelNdx), level)
				<< TestLog::Message << "Note: texture level's size is " << IVec2(level.getWidth(), level.getHeight()) << TestLog::EndMessage;
		}

		swizzleTexture(m_swizzledTexture, *texture, m_baseParams.textureSwizzle);
	}

	return TextureBindingSp(new TextureBinding(texture.release(), sampler));
}